

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoryDecoder.h
# Opt level: O3

FixedDatum *
KDIS::DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::FixedDatum>::FactoryDecode
          (KINT32 EnumVal,KDataStream *stream)

{
  long lVar1;
  FixedDatum *pFVar2;
  long lVar3;
  
  if (m_mDecoders._16_8_ != 0) {
    lVar1 = 0x3276e0;
    lVar3 = m_mDecoders._16_8_;
    do {
      if (EnumVal <= *(int *)(lVar3 + 0x20)) {
        lVar1 = lVar3;
      }
      lVar3 = *(long *)(lVar3 + 0x10 + (ulong)(*(int *)(lVar3 + 0x20) < EnumVal) * 8);
    } while (lVar3 != 0);
    if ((lVar1 != 0x3276e0) && (*(int *)(lVar1 + 0x20) <= EnumVal)) {
      pFVar2 = (FixedDatum *)
               (**(code **)(**(long **)(lVar1 + 0x30) + 0x10))
                         (*(long **)(lVar1 + 0x30),EnumVal,stream);
      return pFVar2;
    }
  }
  return (FixedDatum *)0x0;
}

Assistant:

static DecoderBaseTyp *FactoryDecode(KINT32 EnumVal, KDataStream &stream) noexcept(false)
	{
		// Try to find a decoder
		typename std::map<KINT32, FacDecPtr>::iterator itr = m_mDecoders.find( EnumVal );
		if( itr != m_mDecoders.end() )
		{
			return itr->second->FactoryDecode( EnumVal, stream );
		}
		
		// No decoders found so return NULL.
		return 0;
	}